

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O2

void realse_A_record(record *data)

{
  undefined8 *puVar1;
  bool bVar2;
  undefined8 *__ptr;
  
  bVar2 = true;
  __ptr = (undefined8 *)data->data;
  while (__ptr != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)__ptr[7];
    if (bVar2) {
      free((void *)*__ptr);
    }
    free(__ptr);
    bVar2 = false;
    __ptr = puVar1;
  }
  data->size = 0;
  return;
}

Assistant:

void realse_A_record(struct record*data){
    // int count = data->size;
    // printf("%d\n",count);
    struct record_data *pd = data->data,*tmp;
    #ifdef LOG_INCLUDED
    log_debug("realse a record;label= %s,size = %d",
    ((struct record_data*)data->data)->label,((struct record*)data)->size);
    #endif 
    int has_release_label = false;
    while(pd){
      tmp=pd;
      pd=pd->next;
      if(!has_release_label){
        free(tmp->label);
        has_release_label=true;
      }
      free(tmp);
      // count--;
    }
    if(pd!=NULL){
      fprintf(stderr,"record_data link error!\n");
      exit(EXIT_FAILURE);
    }
    data->size=0;
    // data->data=NULL;
    #ifdef LOG_INCLUDED
    log_debug("realse done");
    #endif
}